

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# archive_read_support_filter_xz.c
# Opt level: O0

ssize_t xz_filter_read(archive_read_filter *self,void **p)

{
  uint uVar1;
  undefined4 uVar2;
  int iVar3;
  void *pvVar4;
  long lVar5;
  archive_read_filter *in_RSI;
  long in_RDI;
  archive_read_filter *in_stack_00000008;
  int ret;
  ssize_t avail_in;
  size_t decompressed;
  private_data_conflict1 *state;
  int in_stack_ffffffffffffffbc;
  undefined4 in_stack_ffffffffffffffc0;
  uint in_stack_ffffffffffffffc8;
  long local_30;
  ssize_t *in_stack_ffffffffffffffd8;
  long *min;
  
  min = *(long **)(in_RDI + 0x50);
  min[3] = min[0x11];
  min[4] = min[0x12];
  while( true ) {
    uVar1 = in_stack_ffffffffffffffc8 & 0xffffff;
    if (min[4] != 0) {
      uVar1 = CONCAT13((char)min[0x14] != '\0',(int3)in_stack_ffffffffffffffc8) ^ 0xff000000;
    }
    in_stack_ffffffffffffffc8 = uVar1;
    if ((in_stack_ffffffffffffffc8 & 0x1000000) == 0) break;
    if (*(char *)((long)min + 0xa1) == '\0') {
      iVar3 = lzip_init(in_stack_00000008);
      if (iVar3 != 0) {
        return (long)iVar3;
      }
      *(undefined1 *)((long)min + 0xa1) = 1;
    }
    pvVar4 = __archive_read_filter_ahead(in_RSI,(size_t)min,in_stack_ffffffffffffffd8);
    *min = (long)pvVar4;
    if ((*min == 0) && (local_30 < 0)) {
      archive_set_error(*(archive **)(in_RDI + 0x18),-1,"truncated input");
      return -0x1e;
    }
    min[1] = local_30;
    iVar3 = lzma_code(min,(min[1] == 0) * '\x03');
    if (iVar3 != 0) {
      if (iVar3 != 1) {
        set_error((archive_read_filter *)CONCAT44(iVar3,in_stack_ffffffffffffffc0),
                  in_stack_ffffffffffffffbc);
        return -0x1e;
      }
      *(undefined1 *)(min + 0x14) = 1;
    }
    __archive_read_filter_consume
              ((archive_read_filter *)CONCAT44(iVar3,in_stack_ffffffffffffffc8),
               CONCAT44(iVar3,in_stack_ffffffffffffffc0));
    min[0x15] = (local_30 - min[1]) + min[0x15];
  }
  lVar5 = min[3] - min[0x11];
  min[0x13] = lVar5 + min[0x13];
  min[0x16] = lVar5 + min[0x16];
  if (lVar5 == 0) {
    in_RSI->position = 0;
    return 0;
  }
  in_RSI->position = min[0x11];
  if (*(int *)(in_RDI + 0x60) != 9) {
    return lVar5;
  }
  uVar2 = lzma_crc32(min[0x11],lVar5,*(undefined4 *)((long)min + 0xa4));
  *(undefined4 *)((long)min + 0xa4) = uVar2;
  if ((char)min[0x14] == '\0') {
    return lVar5;
  }
  iVar3 = lzip_tail(in_RSI);
  if (iVar3 == 0) {
    return lVar5;
  }
  return (long)iVar3;
}

Assistant:

static ssize_t
xz_filter_read(struct archive_read_filter *self, const void **p)
{
	struct private_data *state;
	size_t decompressed;
	ssize_t avail_in;
	int ret;

	state = (struct private_data *)self->data;

	/* Empty our output buffer. */
	state->stream.next_out = state->out_block;
	state->stream.avail_out = state->out_block_size;

	/* Try to fill the output buffer. */
	while (state->stream.avail_out > 0 && !state->eof) {
		if (!state->in_stream) {
			/*
			 * Initialize liblzma for lzip
			 */
			ret = lzip_init(self);
			if (ret != ARCHIVE_OK)
				return (ret);
			state->in_stream = 1;
		}
		state->stream.next_in =
		    __archive_read_filter_ahead(self->upstream, 1, &avail_in);
		if (state->stream.next_in == NULL && avail_in < 0) {
			archive_set_error(&self->archive->archive,
			    ARCHIVE_ERRNO_MISC,
			    "truncated input");
			return (ARCHIVE_FATAL);
		}
		state->stream.avail_in = avail_in;

		/* Decompress as much as we can in one pass. */
		ret = lzma_code(&(state->stream),
		    (state->stream.avail_in == 0)? LZMA_FINISH: LZMA_RUN);
		switch (ret) {
		case LZMA_STREAM_END: /* Found end of stream. */
			state->eof = 1;
			/* FALL THROUGH */
		case LZMA_OK: /* Decompressor made some progress. */
			__archive_read_filter_consume(self->upstream,
			    avail_in - state->stream.avail_in);
			state->member_in +=
			    avail_in - state->stream.avail_in;
			break;
		default:
			set_error(self, ret);
			return (ARCHIVE_FATAL);
		}
	}

	decompressed = state->stream.next_out - state->out_block;
	state->total_out += decompressed;
	state->member_out += decompressed;
	if (decompressed == 0)
		*p = NULL;
	else {
		*p = state->out_block;
		if (self->code == ARCHIVE_FILTER_LZIP) {
			state->crc32 = lzma_crc32(state->out_block,
			    decompressed, state->crc32);
			if (state->eof) {
				ret = lzip_tail(self);
				if (ret != ARCHIVE_OK)
					return (ret);
			}
		}
	}
	return (decompressed);
}